

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O3

bool __thiscall
CLogicSocket::_HandlePing
          (CLogicSocket *this,lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,
          unsigned_short iBodyLength)

{
  time_t tVar1;
  SourceFile file;
  SourceFile file_00;
  Logger LStack_1008;
  
  if (muduo::g_logLevel < 3) {
    file._8_8_ = 0xd;
    file.data_ = "flyd_logic.cc";
    muduo::Logger::Logger(&LStack_1008,file,0xdf);
    if (0x25 < (uint)(((int)&LStack_1008 + 0xfb8) - (int)LStack_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_1008.impl_.stream_.buffer_.cur_,"执行了CLogicSocket::_HandlePing()!"
                      ,0x25);
      LStack_1008.impl_.stream_.buffer_.cur_ = LStack_1008.impl_.stream_.buffer_.cur_ + 0x25;
    }
    muduo::Logger::~Logger(&LStack_1008);
  }
  if (iBodyLength == 0) {
    muduo::MutexLock::lock(&pConn->logicPorcMutex);
    tVar1 = time((time_t *)0x0);
    pConn->lastPingTime = tVar1;
    SendNoBodyPkgToClient(this,pMsgHeader,0);
    if (muduo::g_logLevel < 3) {
      file_00._8_8_ = 0xd;
      file_00.data_ = "flyd_logic.cc";
      muduo::Logger::Logger(&LStack_1008,file_00,0xef);
      if (0x1e < (uint)(((int)&LStack_1008 + 0xfb8) - (int)LStack_1008.impl_.stream_.buffer_.cur_))
      {
        builtin_strncpy(LStack_1008.impl_.stream_.buffer_.cur_,"成功发送心跳包并返回",0x1e
                       );
        LStack_1008.impl_.stream_.buffer_.cur_ = LStack_1008.impl_.stream_.buffer_.cur_ + 0x1e;
      }
      muduo::Logger::~Logger(&LStack_1008);
    }
    (pConn->logicPorcMutex).holder_ = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&pConn->logicPorcMutex);
  }
  return iBodyLength == 0;
}

Assistant:

bool CLogicSocket::_HandlePing(lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,unsigned short iBodyLength)
{
    LOG_INFO << "执行了CLogicSocket::_HandlePing()!" ;
    //（1）首先判断心跳包的合法性
    if(iBodyLength != 0)   //有包体则认为是  非法包
    {
        
        return false;
    }

    muduo::MutexLockGuard lock(pConn->logicPorcMutex);
    pConn->lastPingTime = time(NULL);  //更新心跳包的时间

    //服务器给客户端返回一个只有包头的数据包
    SendNoBodyPkgToClient(pMsgHeader, _CMD_PING);



    LOG_INFO << "成功发送心跳包并返回";

    return true;
}